

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O0

pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_bool>
 __thiscall
Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::
insert_simplex<std::vector<int,std::allocator<int>>>
          (Simplex_tree<Gudhi::Simplex_tree_options_default> *this,
          vector<int,_std::allocator<int>_> *simplex,Filtration_value *filtration)

{
  bool bVar1;
  iterator __first;
  iterator __last;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar2;
  pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_bool>
  pVar3;
  allocator<int> local_71;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_70;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_68;
  undefined1 local_60 [8];
  vector<int,_std::allocator<int>_> copy;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
  local_40;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_38;
  const_iterator last;
  const_iterator first;
  Filtration_value *filtration_local;
  vector<int,_std::allocator<int>_> *simplex_local;
  Simplex_tree<Gudhi::Simplex_tree_options_default> *this_local;
  
  last = std::begin<std::vector<int,std::allocator<int>>>
                   ((vector<int,_std::allocator<int>_> *)filtration);
  local_38._M_current =
       (int *)std::end<std::vector<int,std::allocator<int>>>
                        ((vector<int,_std::allocator<int>_> *)filtration);
  bVar1 = __gnu_cxx::operator==(&last,&local_38);
  if (bVar1) {
    null_simplex();
    copy.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._7_1_ = 1;
    std::
    pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_bool>
    ::
    pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_bool,_true>
              ((pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_bool>
                *)this,&local_40,
               (bool *)((long)&copy.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage + 7));
    uVar2 = extraout_RDX;
  }
  else {
    local_68._M_current = last._M_current;
    local_70._M_current = local_38._M_current;
    std::allocator<int>::allocator(&local_71);
    std::vector<int,std::allocator<int>>::
    vector<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,void>
              ((vector<int,std::allocator<int>> *)local_60,local_68,local_70,&local_71);
    std::allocator<int>::~allocator(&local_71);
    __first = std::begin<std::vector<int,std::allocator<int>>>
                        ((vector<int,_std::allocator<int>_> *)local_60);
    __last = std::end<std::vector<int,std::allocator<int>>>
                       ((vector<int,_std::allocator<int>_> *)local_60);
    std::sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__first._M_current
               ,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__last._M_current
              );
    insert_simplex_raw<std::vector<int,std::allocator<int>>>
              (this,simplex,(Filtration_value *)local_60);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_60);
    uVar2 = extraout_RDX_00;
  }
  pVar3._8_8_ = uVar2;
  pVar3.first.m_ptr =
       (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
        *)this;
  return pVar3;
}

Assistant:

std::pair<Simplex_handle, bool> insert_simplex(const InputVertexRange & simplex,
                                                 const Filtration_value& filtration = Filtration_value()) {
    auto first = std::begin(simplex);
    auto last = std::end(simplex);

    if (first == last)
      return std::pair<Simplex_handle, bool>(null_simplex(), true);  // ----->>

    // Copy before sorting
    std::vector<Vertex_handle> copy(first, last);
    std::sort(std::begin(copy), std::end(copy));
    return insert_simplex_raw(copy, filtration);
  }